

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O0

NonMaximumSuppression * __thiscall
CoreML::Specification::Model::mutable_nonmaximumsuppression(Model *this)

{
  bool bVar1;
  NonMaximumSuppression *this_00;
  Model *this_local;
  
  bVar1 = has_nonmaximumsuppression(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_nonmaximumsuppression(this);
    this_00 = (NonMaximumSuppression *)operator_new(0x70);
    NonMaximumSuppression::NonMaximumSuppression(this_00);
    (this->Type_).nonmaximumsuppression_ = this_00;
  }
  return (NonMaximumSuppression *)(this->Type_).pipelineclassifier_;
}

Assistant:

inline ::CoreML::Specification::NonMaximumSuppression* Model::mutable_nonmaximumsuppression() {
  if (!has_nonmaximumsuppression()) {
    clear_Type();
    set_has_nonmaximumsuppression();
    Type_.nonmaximumsuppression_ = new ::CoreML::Specification::NonMaximumSuppression;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.nonMaximumSuppression)
  return Type_.nonmaximumsuppression_;
}